

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_parse.c
# Opt level: O1

MPP_RET store_cur_nalu(H264dCurCtx_t *p_Cur,H264dCurStream_t *p_strm,H264dDxvaCtx_t *dxva_ctx)

{
  RK_U8 *pRVar1;
  uint uVar2;
  int iVar3;
  RK_U8 *pRVar4;
  h264d_input_ctx_t *phVar5;
  uint uVar6;
  bool bVar7;
  MPP_RET MVar8;
  undefined8 uVar9;
  uint add_size;
  RK_U32 RVar10;
  MPP_RET local_44;
  
  local_44 = MPP_ERR_UNKNOW;
  if ((0x14 < (uint)p_strm->nalu_type) || ((0x10c1e2U >> (p_strm->nalu_type & 0x1fU) & 1) == 0))
  goto LAB_0018b96a;
  uVar6 = 0x3200;
  if (p_strm->nalu_len < 0x3200) {
    uVar6 = p_strm->nalu_len;
  }
  add_size = uVar6 + 8;
  if (((ulong)p_strm->tmp_offset != 0) && (p_strm->head_offset == 0)) {
    memcpy(p_strm->head_buf,p_strm->tmp_buf,(ulong)p_strm->tmp_offset);
    p_strm->head_offset = p_strm->head_offset + p_strm->tmp_offset;
    p_strm->tmp_offset = 0;
    if (((byte)h264d_debug & 8) != 0) {
      _mpp_log_l(4,"h264d_parse","copy tmp header to empty header of new frame",(char *)0x0);
    }
  }
  MVar8 = MPP_ERR_UNKNOW;
  if (p_strm->head_offset + add_size < p_strm->head_max_size) {
LAB_0018b8d7:
    local_44 = MVar8;
    pRVar4 = p_strm->head_buf;
    uVar2 = p_strm->head_offset;
    pRVar1 = pRVar4 + uVar2;
    pRVar1[0] = '\0';
    pRVar1[1] = '\0';
    *(short *)(pRVar1 + 2) = (short)p_strm->nalu_type;
    *(uint *)(pRVar1 + 4) = uVar6;
    memcpy(pRVar1 + 8,p_strm->nalu_buf,(ulong)uVar6);
    p_strm->head_offset = p_strm->head_offset + add_size;
    if (((byte)h264d_debug & 8) != 0) {
      _mpp_log_l(4,"h264d_parse","store current header, NAL type %d",(char *)0x0,
                 (ulong)(uint)p_strm->nalu_type);
    }
    bVar7 = true;
    if ((p_Cur->p_Dec->have_slice_data != '\0') && ((p_strm->nalu_type | 4U) != 5)) {
      if (p_strm->tmp_max_size <= p_strm->tmp_offset + add_size) {
        MVar8 = realloc_buffer(&p_strm->tmp_buf,&p_strm->tmp_max_size,add_size);
        local_44 = MPP_OK;
        if (MVar8 < MPP_OK) {
          local_44 = MVar8;
          if (((byte)h264d_debug & 4) != 0) {
            uVar9 = 0x1a5;
            goto LAB_0018bb30;
          }
          goto LAB_0018ba91;
        }
      }
      memcpy(p_strm->tmp_buf + p_strm->tmp_offset,pRVar4 + uVar2,(ulong)add_size);
      p_strm->tmp_offset = p_strm->tmp_offset + add_size;
      if (((byte)h264d_debug & 8) != 0) {
        _mpp_log_l(4,"h264d_parse","store current header to tmp header, NAL type %d",(char *)0x0,
                   (ulong)(uint)p_strm->nalu_type);
      }
    }
  }
  else {
    local_44 = realloc_buffer(&p_strm->head_buf,&p_strm->head_max_size,add_size);
    MVar8 = MPP_OK;
    if (MPP_NOK < local_44) goto LAB_0018b8d7;
    if (((byte)h264d_debug & 4) == 0) {
LAB_0018ba91:
      bVar7 = false;
    }
    else {
      uVar9 = 0x194;
LAB_0018bb30:
      bVar7 = false;
      _mpp_log_l(4,"h264d_parse","Function error(%d).\n",(char *)0x0,uVar9);
    }
  }
  if (!bVar7) {
    return local_44;
  }
LAB_0018b96a:
  if ((p_strm->nalu_type | 4U) == 5) {
    RVar10 = p_strm->nalu_len + 3;
    if ((dxva_ctx->strm_offset + RVar10 < dxva_ctx->max_strm_size) ||
       (local_44 = realloc_buffer(&dxva_ctx->bitstream,&dxva_ctx->max_strm_size,RVar10),
       MPP_NOK < local_44)) {
      pRVar1 = dxva_ctx->bitstream + dxva_ctx->strm_offset;
      pRVar1[2] = '\x01';
      pRVar1[0] = '\0';
      pRVar1[1] = '\0';
      memcpy(pRVar1 + 3,p_strm->nalu_buf,(ulong)p_strm->nalu_len);
      dxva_ctx->strm_offset = dxva_ctx->strm_offset + RVar10;
      bVar7 = true;
    }
    else if (((byte)h264d_debug & 4) == 0) {
      bVar7 = false;
    }
    else {
      bVar7 = false;
      _mpp_log_l(4,"h264d_parse","Function error(%d).\n",(char *)0x0,0x1b5);
    }
    if (!bVar7) {
      return local_44;
    }
  }
  if (((p_Cur->p_Dec->cfg->base).enable_hdr_meta != 0) && (p_strm->nalu_type == 0x1c)) {
    mpp_h264d_fill_dynamic_meta(p_Cur,p_strm->nalu_buf + 2,p_strm->nalu_len - 2,0xb);
  }
  if ((h264d_debug._2_1_ & 1) != 0) {
    phVar5 = p_Cur->p_Inp;
    iVar3 = p_strm->nalu_type;
    if (iVar3 - 7U < 2) {
      if (phVar5->spspps_update_flag != 0) {
        pRVar1 = phVar5->spspps_buf + phVar5->spspps_offset;
        pRVar1[2] = '\x01';
        pRVar1[0] = '\0';
        pRVar1[1] = '\0';
        memcpy(pRVar1 + 3,p_strm->nalu_buf,(ulong)p_strm->nalu_len);
        RVar10 = p_strm->nalu_len + phVar5->spspps_offset + 3;
        phVar5->spspps_offset = RVar10;
        phVar5->spspps_len = RVar10;
      }
    }
    else if ((iVar3 == 1) || (iVar3 == 5)) {
      phVar5->spspps_offset = 0;
      phVar5->spspps_update_flag = 1;
    }
  }
  return MPP_OK;
}

Assistant:

static MPP_RET store_cur_nalu(H264dCurCtx_t *p_Cur, H264dCurStream_t *p_strm, H264dDxvaCtx_t *dxva_ctx)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    RK_U8 *p_des = NULL;

    //!< fill head buffer
    if (   (p_strm->nalu_type == H264_NALU_TYPE_SLICE)
           || (p_strm->nalu_type == H264_NALU_TYPE_IDR)
           || (p_strm->nalu_type == H264_NALU_TYPE_SPS)
           || (p_strm->nalu_type == H264_NALU_TYPE_PPS)
           || (p_strm->nalu_type == H264_NALU_TYPE_SUB_SPS)
           || (p_strm->nalu_type == H264_NALU_TYPE_SEI)
           || (p_strm->nalu_type == H264_NALU_TYPE_PREFIX)
           || (p_strm->nalu_type == H264_NALU_TYPE_SLC_EXT)) {

        RK_U32 head_size = MPP_MIN(HEAD_SYNTAX_MAX_SIZE, p_strm->nalu_len);
        RK_U32 add_size = head_size + sizeof(H264dNaluHead_t);

        //!< judge new frame
        if (p_strm->tmp_offset && !p_strm->head_offset) {
            memcpy(p_strm->head_buf, p_strm->tmp_buf, p_strm->tmp_offset);
            p_strm->head_offset += p_strm->tmp_offset;
            p_strm->tmp_offset = 0;

            H264D_LOG("copy tmp header to empty header of new frame");
        }

        if ((p_strm->head_offset + add_size) >= p_strm->head_max_size) {
            FUN_CHECK(ret = realloc_buffer(&p_strm->head_buf, &p_strm->head_max_size, add_size));
        }
        p_des = &p_strm->head_buf[p_strm->head_offset];
        ((H264dNaluHead_t *)p_des)->is_frame_end  = 0;
        ((H264dNaluHead_t *)p_des)->nalu_type = p_strm->nalu_type;
        ((H264dNaluHead_t *)p_des)->sodb_len = head_size;
        memcpy(p_des + sizeof(H264dNaluHead_t), p_strm->nalu_buf, head_size);
        p_strm->head_offset += add_size;

        H264D_LOG("store current header, NAL type %d", p_strm->nalu_type);

        // store NAL header except slice NAL
        if (p_Cur->p_Dec->have_slice_data && p_strm->nalu_type != H264_NALU_TYPE_IDR &&
            p_strm->nalu_type != H264_NALU_TYPE_SLICE) {
            RK_U8 *p_tmp = NULL;

            if ((p_strm->tmp_offset + add_size) >= p_strm->tmp_max_size) {
                FUN_CHECK(ret = realloc_buffer(&p_strm->tmp_buf, &p_strm->tmp_max_size, add_size));
            }

            p_tmp = &p_strm->tmp_buf[p_strm->tmp_offset];
            memcpy(p_tmp, p_des, add_size);
            p_strm->tmp_offset += add_size;

            H264D_LOG("store current header to tmp header, NAL type %d", p_strm->nalu_type);
        }
    }    //!< fill sodb buffer
    if ((p_strm->nalu_type == H264_NALU_TYPE_SLICE)
        || (p_strm->nalu_type == H264_NALU_TYPE_IDR)) {

        RK_U32 add_size = p_strm->nalu_len + sizeof(g_start_precode);

        if ((dxva_ctx->strm_offset + add_size) >= dxva_ctx->max_strm_size) {
            FUN_CHECK(ret = realloc_buffer(&dxva_ctx->bitstream, &dxva_ctx->max_strm_size, add_size));
        }

        p_des = &dxva_ctx->bitstream[dxva_ctx->strm_offset];
        memcpy(p_des, g_start_precode, sizeof(g_start_precode));
        memcpy(p_des + sizeof(g_start_precode), p_strm->nalu_buf, p_strm->nalu_len);
        dxva_ctx->strm_offset += add_size;
    }

    /* Dolby Vision RPUs masquerade as unregistered NALs of type 28. */
    if (p_Cur->p_Dec->cfg->base.enable_hdr_meta && p_strm->nalu_type == H264_NALU_TYPE_UNSPECIFIED28)
        mpp_h264d_fill_dynamic_meta(p_Cur, p_strm->nalu_buf + 2, p_strm->nalu_len - 2, DOLBY);

    if (h264d_debug & H264D_DBG_WRITE_ES_EN) {
        H264dInputCtx_t *p_Inp = p_Cur->p_Inp;
        if ((p_strm->nalu_type == H264_NALU_TYPE_SPS)
            || (p_strm->nalu_type == H264_NALU_TYPE_PPS)) {
            if (p_Inp->spspps_update_flag) {
                p_des = &p_Inp->spspps_buf[p_Inp->spspps_offset];
                memcpy(p_des, g_start_precode, sizeof(g_start_precode));
                memcpy(p_des + sizeof(g_start_precode), p_strm->nalu_buf, p_strm->nalu_len);
                p_Inp->spspps_offset += p_strm->nalu_len + sizeof(g_start_precode);
                p_Inp->spspps_len = p_Inp->spspps_offset;
            }
        } else if ((p_strm->nalu_type == H264_NALU_TYPE_SLICE)
                   || (p_strm->nalu_type == H264_NALU_TYPE_IDR)) {
            p_Cur->p_Inp->spspps_update_flag = 1;
            p_Inp->spspps_offset = 0;
        }
    }

    return ret = MPP_OK;
__FAILED:
    return ret;
}